

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core_write.cpp
# Opt level: O3

string * ScriptToAsmStr_abi_cxx11_
                   (string *__return_storage_ptr__,CScript *script,bool fAttemptSighashDecode)

{
  undefined1 uVar1;
  bool bVar2;
  uint uVar3;
  _Alloc_hider _Var4;
  _Base_ptr p_Var5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  uint uVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  CScript *pCVar10;
  CScript *pCVar11;
  _Base_ptr p_Var12;
  long in_FS_OFFSET;
  Span<const_unsigned_char> s;
  Span<const_unsigned_char> s_00;
  const_iterator pc;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vch;
  opcodetype opcode;
  string strSigHashDecode;
  const_iterator local_c0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_b8;
  opcodetype local_9c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (uchar *)0x0;
  local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar3 = (script->super_CScriptBase)._size;
  pCVar11 = (CScript *)(script->super_CScriptBase)._union.indirect_contents.indirect;
  uVar7 = uVar3 - 0x1d;
  local_c0.ptr = (uchar *)pCVar11;
  if (uVar3 < 0x1d) {
    uVar7 = uVar3;
    local_c0.ptr = (uchar *)script;
  }
  if (0 < (int)uVar7) {
    do {
      if (__return_storage_ptr__->_M_string_length != 0) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (__return_storage_ptr__," ");
        uVar3 = (script->super_CScriptBase)._size;
        pCVar11 = (CScript *)(script->super_CScriptBase)._union.indirect_contents.indirect;
      }
      uVar7 = uVar3 - 0x1d;
      if (uVar3 < 0x1d) {
        uVar7 = uVar3;
      }
      if (uVar3 < 0x1d) {
        pCVar11 = script;
      }
      bVar2 = GetScriptOp(&local_c0,
                          (uchar *)((long)&(pCVar11->super_CScriptBase)._union + (long)(int)uVar7),
                          &local_9c,&local_b8);
      if (!bVar2) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (__return_storage_ptr__,"[error]");
        break;
      }
      if (local_9c < OP_1NEGATE) {
        s.m_size = (long)local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start;
        if (s.m_size < 5) {
          CScriptNum::CScriptNum((CScriptNum *)&local_78,&local_b8,false,4);
          _Var4._M_p = local_78._M_dataplus._M_p;
          if ((long)local_78._M_dataplus._M_p < -0x7fffffff) {
            _Var4._M_p = (pointer)0xffffffff80000000;
          }
          if (0x7ffffffe < (long)_Var4._M_p) {
            _Var4._M_p = (pointer)0x7fffffff;
          }
          local_98._M_dataplus._M_p._0_4_ = SUB84(_Var4._M_p,0);
          tinyformat::format<int>(&local_58,"%d",(int *)&local_98);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                    (__return_storage_ptr__,local_58._M_dataplus._M_p,local_58._M_string_length);
        }
        else if (fAttemptSighashDecode) {
          uVar3 = (script->super_CScriptBase)._size;
          uVar7 = uVar3 - 0x1d;
          if (uVar3 < 0x1d) {
            uVar7 = uVar3;
          }
          if (uVar7 != 0) {
            pCVar11 = script;
            if (0x1c < uVar3) {
              pCVar11 = (CScript *)(script->super_CScriptBase)._union.indirect_contents.indirect;
            }
            if ((10000 < uVar7) || ((pCVar11->super_CScriptBase)._union.direct[0] == 'j'))
            goto LAB_00d58aaa;
          }
          local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
          local_58._M_string_length = 0;
          local_58.field_2._M_local_buf[0] = '\0';
          bVar2 = CheckSignatureEncoding(&local_b8,2,(ScriptError *)0x0);
          if ((bVar2) &&
             (mapSigHashTypes_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent !=
              (_Base_ptr)0x0)) {
            uVar1 = local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish[-1];
            p_Var5 = &mapSigHashTypes_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header;
            p_Var12 = mapSigHashTypes_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header.
                      _M_parent;
            do {
              bVar2 = (byte)(char)p_Var12[1]._M_color < (byte)uVar1;
              if (!bVar2) {
                p_Var5 = p_Var12;
              }
              p_Var12 = (&p_Var12->_M_left)[bVar2];
            } while (p_Var12 != (_Base_ptr)0x0);
            if (((_Rb_tree_header *)p_Var5 !=
                 &mapSigHashTypes_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) &&
               ((byte)(char)p_Var5[1]._M_color <= (byte)uVar1)) {
              std::operator+(&local_98,"[",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &p_Var5[1]._M_parent);
              pbVar6 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                 (&local_98,"]");
              local_78._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
              paVar8 = &pbVar6->field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_78._M_dataplus._M_p == paVar8) {
                local_78.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
                local_78.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
                local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
              }
              else {
                local_78.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
              }
              local_78._M_string_length = pbVar6->_M_string_length;
              (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
              pbVar6->_M_string_length = 0;
              (pbVar6->field_2)._M_local_buf[0] = '\0';
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              operator=(&local_58,&local_78);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_78._M_dataplus._M_p != &local_78.field_2) {
                operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT44(local_98._M_dataplus._M_p._4_4_,local_98._M_dataplus._M_p._0_4_) !=
                  &local_98.field_2) {
                operator_delete((undefined1 *)
                                CONCAT44(local_98._M_dataplus._M_p._4_4_,
                                         local_98._M_dataplus._M_p._0_4_),
                                local_98.field_2._M_allocated_capacity + 1);
              }
              local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish + -1;
            }
          }
          s_00.m_size = (long)local_b8.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)local_b8.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start;
          s_00.m_data = local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start;
          HexStr_abi_cxx11_(&local_98,s_00);
          pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   _M_append(&local_98,local_58._M_dataplus._M_p,local_58._M_string_length);
          local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
          paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(pbVar6->_M_dataplus)._M_p;
          paVar9 = &pbVar6->field_2;
          if (paVar8 == paVar9) {
            local_78.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
            local_78.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
          }
          else {
            local_78.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
            local_78._M_dataplus._M_p = (pointer)paVar8;
          }
          local_78._M_string_length = pbVar6->_M_string_length;
          (pbVar6->_M_dataplus)._M_p = (pointer)paVar9;
          pbVar6->_M_string_length = 0;
          (pbVar6->field_2)._M_local_buf[0] = '\0';
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                    (__return_storage_ptr__,local_78._M_dataplus._M_p,local_78._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_98._M_dataplus._M_p._4_4_,local_98._M_dataplus._M_p._0_4_) !=
              &local_98.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(local_98._M_dataplus._M_p._4_4_,local_98._M_dataplus._M_p._0_4_
                                    ),local_98.field_2._M_allocated_capacity + 1);
          }
        }
        else {
LAB_00d58aaa:
          s.m_data = local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          HexStr_abi_cxx11_(&local_58,s);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                    (__return_storage_ptr__,local_58._M_dataplus._M_p,local_58._M_string_length);
        }
      }
      else {
        GetOpName_abi_cxx11_(&local_58,local_9c);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (__return_storage_ptr__,local_58._M_dataplus._M_p,local_58._M_string_length);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,
                        CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                 local_58.field_2._M_local_buf[0]) + 1);
      }
      uVar3 = (script->super_CScriptBase)._size;
      uVar7 = uVar3 - 0x1d;
      if (uVar3 < 0x1d) {
        uVar7 = uVar3;
      }
      pCVar11 = (CScript *)(script->super_CScriptBase)._union.indirect_contents.indirect;
      pCVar10 = pCVar11;
      if (uVar3 < 0x1d) {
        pCVar10 = script;
      }
    } while (local_c0.ptr < (CScript *)((pCVar10->super_CScriptBase)._union.direct + (int)uVar7));
  }
  if (local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uchar *)0x0) {
    operator_delete(local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string ScriptToAsmStr(const CScript& script, const bool fAttemptSighashDecode)
{
    std::string str;
    opcodetype opcode;
    std::vector<unsigned char> vch;
    CScript::const_iterator pc = script.begin();
    while (pc < script.end()) {
        if (!str.empty()) {
            str += " ";
        }
        if (!script.GetOp(pc, opcode, vch)) {
            str += "[error]";
            return str;
        }
        if (0 <= opcode && opcode <= OP_PUSHDATA4) {
            if (vch.size() <= static_cast<std::vector<unsigned char>::size_type>(4)) {
                str += strprintf("%d", CScriptNum(vch, false).getint());
            } else {
                // the IsUnspendable check makes sure not to try to decode OP_RETURN data that may match the format of a signature
                if (fAttemptSighashDecode && !script.IsUnspendable()) {
                    std::string strSigHashDecode;
                    // goal: only attempt to decode a defined sighash type from data that looks like a signature within a scriptSig.
                    // this won't decode correctly formatted public keys in Pubkey or Multisig scripts due to
                    // the restrictions on the pubkey formats (see IsCompressedOrUncompressedPubKey) being incongruous with the
                    // checks in CheckSignatureEncoding.
                    if (CheckSignatureEncoding(vch, SCRIPT_VERIFY_STRICTENC, nullptr)) {
                        const unsigned char chSigHashType = vch.back();
                        const auto it = mapSigHashTypes.find(chSigHashType);
                        if (it != mapSigHashTypes.end()) {
                            strSigHashDecode = "[" + it->second + "]";
                            vch.pop_back(); // remove the sighash type byte. it will be replaced by the decode.
                        }
                    }
                    str += HexStr(vch) + strSigHashDecode;
                } else {
                    str += HexStr(vch);
                }
            }
        } else {
            str += GetOpName(opcode);
        }
    }
    return str;
}